

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O3

void __thiscall
ruckig::BrakeProfile::get_second_order_position_brake_trajectory
          (BrakeProfile *this,double v0,double vMax,double vMin,double aMax,double aMin)

{
  (this->a)._M_elems[0] = 0.0;
  (this->a)._M_elems[1] = 0.0;
  (this->j)._M_elems[0] = 0.0;
  (this->j)._M_elems[1] = 0.0;
  (this->t)._M_elems[0] = 0.0;
  (this->t)._M_elems[1] = 0.0;
  if ((((aMax != 0.0) || (NAN(aMax))) && ((aMin != 0.0 || (NAN(aMin))))) &&
     ((vMax < v0 || (vMax = vMin, aMin = aMax, v0 < vMin)))) {
    (this->a)._M_elems[0] = aMin;
    (this->t)._M_elems[0] = (vMax - v0) / aMin + 2.2e-14;
  }
  return;
}

Assistant:

void BrakeProfile::get_second_order_position_brake_trajectory(double v0, double vMax, double vMin, double aMax, double aMin) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;
    a[0] = 0.0;
    a[1] = 0.0;

    if (aMax == 0.0 || aMin == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (v0 > vMax) {
        a[0] = aMin;
        t[0] = (vMax - v0)/aMin + eps;

    } else if (v0 < vMin) {
        a[0] = aMax;
        t[0] = (vMin - v0)/aMax + eps;
    }
}